

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O1

void __thiscall Catch::XmlReporter::testGroupEnded(XmlReporter *this,TestGroupStats *testGroupStats)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 this_00;
  XmlWriter *this_01;
  long *local_c0 [2];
  long local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  Option<Catch::GroupInfo>::reset
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).currentGroupInfo.
              super_Option<Catch::GroupInfo>);
  (this->super_StreamingReporterBase<Catch::XmlReporter>).currentGroupInfo.used = false;
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"OverallResults","");
  this_01 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)local_a0,(string *)this_01,(XmlFormatting)local_c0);
  paVar2 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"successes","");
  this_00 = local_a0._0_8_;
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_a0._0_8_,&local_50,&(testGroupStats->totals).assertions.passed);
  local_70._M_allocated_capacity = (size_type)&local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"failures","");
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)this_00,(string *)&local_70,&(testGroupStats->totals).assertions.failed);
  pbVar1 = (pointer)(local_90 + 0x10);
  local_90._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"expectedFailures","");
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)this_00,(string *)local_90,
             &(testGroupStats->totals).assertions.failedButOk);
  if ((pointer)local_90._0_8_ != pbVar1) {
    operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_allocated_capacity != &local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,
                    (ulong)(local_60._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a0);
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"OverallResultsCases","");
  XmlWriter::scopedElement((XmlWriter *)local_a0,(string *)this_01,(XmlFormatting)local_c0);
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"successes","");
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_a0._0_8_,&local_50,&(testGroupStats->totals).testCases.passed);
  local_70._M_allocated_capacity = (size_type)&local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"failures","");
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_a0._0_8_,(string *)&local_70,
             &(testGroupStats->totals).testCases.failed);
  local_90._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"expectedFailures","");
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_a0._0_8_,(string *)local_90,
             &(testGroupStats->totals).testCases.failedButOk);
  if ((pointer)local_90._0_8_ != pbVar1) {
    operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_allocated_capacity != &local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,
                    (ulong)(local_60._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a0);
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  XmlWriter::endElement(this_01,Newline|Indent);
  return;
}

Assistant:

void XmlReporter::testGroupEnded( TestGroupStats const& testGroupStats ) {
        StreamingReporterBase::testGroupEnded( testGroupStats );
        // TODO: Check testGroupStats.aborting and act accordingly.
        m_xml.scopedElement( "OverallResults" )
            .writeAttribute( "successes", testGroupStats.totals.assertions.passed )
            .writeAttribute( "failures", testGroupStats.totals.assertions.failed )
            .writeAttribute( "expectedFailures", testGroupStats.totals.assertions.failedButOk );
        m_xml.scopedElement( "OverallResultsCases")
            .writeAttribute( "successes", testGroupStats.totals.testCases.passed )
            .writeAttribute( "failures", testGroupStats.totals.testCases.failed )
            .writeAttribute( "expectedFailures", testGroupStats.totals.testCases.failedButOk );
        m_xml.endElement();
    }